

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIFileOpenDialog::draw(CGUIFileOpenDialog *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  char cVar2;
  undefined4 uVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  rect<int> rect;
  undefined1 local_68 [16];
  string<wchar_t> local_50;
  
  if (this->field_0xa0 == '\x01') {
    plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    local_68._0_8_ = *(undefined8 *)&this->field_0x40;
    local_68._8_8_ = *(undefined8 *)&this->field_0x48;
    uVar3 = (**(code **)*plVar5)(plVar5,5);
    local_68 = (**(code **)(*plVar5 + 0x78))(plVar5,this,1,uVar3,local_68,&this->field_0x50,0);
    if (*(int *)&this->field_0xb0 != 0) {
      local_68._0_4_ = local_68._0_4_ + 2;
      iVar4 = (**(code **)(*plVar5 + 0x10))(plVar5,2);
      local_68._8_4_ = (local_68._8_4_ - iVar4) + -5;
      puVar6 = (undefined8 *)(**(code **)(*plVar5 + 0x30))(plVar5,2);
      if (puVar6 != (undefined8 *)0x0) {
        paVar1 = &local_50.str.field_2;
        local_50.str._M_string_length = 0;
        local_50.str.field_2._M_local_buf[0] = L'\0';
        local_50.str._M_dataplus._M_p = (pointer)paVar1;
        core::string<wchar_t>::operator=(&local_50,*(wchar_t **)&this->field_0xa8);
        uVar3 = (**(code **)*plVar5)(plVar5,6);
        (**(code **)*puVar6)(puVar6,&local_50,local_68,uVar3,0,1,&this->field_0x50);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_50.str._M_dataplus._M_p != paVar1) {
          operator_delete(local_50.str._M_dataplus._M_p,
                          CONCAT44(local_50.str.field_2._M_local_buf[1],
                                   local_50.str.field_2._M_local_buf[0]) * 4 + 4);
        }
      }
    }
    cVar2 = (**(code **)(*(long *)this + 0x68))(this);
    if (cVar2 != '\0') {
      for (puVar6 = *(undefined8 **)&this->field_0x8; puVar6 != (undefined8 *)&this->field_0x8;
          puVar6 = (undefined8 *)*puVar6) {
        (**(code **)(*(long *)puVar6[2] + 0x50))();
      }
    }
  }
  return;
}

Assistant:

void CGUIFileOpenDialog::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	core::rect<s32> rect = AbsoluteRect;

	rect = skin->draw3DWindowBackground(this, true, skin->getColor(EGDC_ACTIVE_BORDER),
			rect, &AbsoluteClippingRect);

	if (Text.size()) {
		rect.UpperLeftCorner.X += 2;
		rect.LowerRightCorner.X -= skin->getSize(EGDS_WINDOW_BUTTON_WIDTH) + 5;

		IGUIFont *font = skin->getFont(EGDF_WINDOW);
		if (font)
			font->draw(Text.c_str(), rect,
					skin->getColor(EGDC_ACTIVE_CAPTION),
					false, true, &AbsoluteClippingRect);
	}

	IGUIElement::draw();
}